

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::HasFieldSingular
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  FieldDescriptor *field_00;
  FieldDescriptor *message_00;
  bool bVar1;
  uint32_t uVar2;
  CppType CVar3;
  FieldOptions *this_00;
  LogMessage *pLVar4;
  uint32_t *hasbits;
  Message **ppMVar5;
  bool local_89;
  LogMessage local_40;
  Voidify local_29;
  FieldDescriptor *local_28;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_28 = field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  this_00 = FieldDescriptor::options(field);
  bVar1 = FieldOptions::weak(this_00);
  if (!bVar1) {
    uVar2 = internal::ReflectionSchema::HasBitIndex(&this->schema_,local_28);
    message_00 = field_local;
    field_00 = local_28;
    if (uVar2 == 0xffffffff) {
      CVar3 = FieldDescriptor::cpp_type(local_28);
      if (CVar3 == CPPTYPE_MESSAGE) {
        bVar1 = internal::ReflectionSchema::IsDefaultInstance(&this->schema_,(Message *)field_local)
        ;
        local_89 = false;
        if (!bVar1) {
          ppMVar5 = GetRaw<google::protobuf::Message_const*>(this,(Message *)field_local,local_28);
          local_89 = *ppMVar5 != (Message *)0x0;
        }
        this_local._7_1_ = local_89;
      }
      else {
        this_local._7_1_ = IsSingularFieldNonEmpty(this,(Message *)field_local,local_28);
      }
    }
    else {
      hasbits = GetHasBits(this,(Message *)field_local);
      uVar2 = internal::ReflectionSchema::HasBitIndex(&this->schema_,local_28);
      this_local._7_1_ =
           IsFieldPresentGivenHasbits(this,(Message *)message_00,field_00,hasbits,uVar2);
    }
    return this_local._7_1_;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xc50,"!field->options().weak()");
  pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

bool Reflection::HasFieldSingular(const Message& message,
                                  const FieldDescriptor* field) const {
  ABSL_DCHECK(!field->options().weak());
  if (schema_.HasBitIndex(field) != static_cast<uint32_t>(-1)) {
    return IsFieldPresentGivenHasbits(message, field, GetHasBits(message),
                                      schema_.HasBitIndex(field));
  }

  // The python implementation traditionally assumes that proto3 messages don't
  // have hasbits. As a result, proto3 objects created through dynamic message
  // in Python won't have hasbits. We need the following code to preserve
  // compatibility.
  // NOTE: It would be nice to be able to remove it, but we need one
  // or more breaking changes in order to do so.
  //
  // proto3 with no has-bits. All fields present except messages, which are
  // present only if their message-field pointer is non-null.
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return !schema_.IsDefaultInstance(message) &&
           GetRaw<const Message*>(message, field) != nullptr;
  }

  // Non-message field (and non-oneof, since that was handled in HasField()
  // before calling us), and singular (again, checked in HasField). So, this
  // field must be a scalar.

  return IsSingularFieldNonEmpty(message, field);
}